

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O2

bool __thiscall
QAbstractSocket::setSocketDescriptor
          (QAbstractSocket *this,qintptr socketDescriptor,SocketState socketState,OpenMode openMode)

{
  QAbstractSocketPrivate *this_00;
  QHostAddressPrivate *pQVar1;
  char cVar2;
  quint16 qVar3;
  int iVar4;
  SocketError SVar5;
  QAbstractSocketEngine *pQVar6;
  int iVar7;
  bool bVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&this->field_0x8;
  QAbstractSocketPrivate::resetSocketLayer(this_00);
  iVar7 = (int)this_00;
  QIODevicePrivate::setReadChannelCount(iVar7);
  QIODevicePrivate::setWriteChannelCount(iVar7);
  pQVar6 = QAbstractSocketEngine::createSocketEngine(socketDescriptor,(QObject *)this);
  this_00->socketEngine = pQVar6;
  if (pQVar6 == (QAbstractSocketEngine *)0x0) {
    bVar8 = false;
    tr((QString *)&local_50,"Operation on socket is not supported",(char *)0x0,-1);
    this_00->socketError = UnsupportedSocketOperationError;
    QString::operator=((QString *)&this_00->field_0x168,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  else {
    cVar2 = (**(code **)(*(long *)pQVar6 + 0x68))(pQVar6,socketDescriptor,socketState);
    if (cVar2 == '\0') {
      SVar5 = QAbstractSocketEngine::error((QAbstractSocketEngine *)this_00->socketEngine);
      QAbstractSocketEngine::errorString
                ((QString *)&local_50,(QAbstractSocketEngine *)this_00->socketEngine);
      this_00->socketError = SVar5;
      QString::operator=((QString *)&this_00->field_0x168,(QString *)&local_50);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      bVar8 = false;
    }
    else {
      this_00->socketError = UnknownSocketError;
      if (*(long *)(*(long *)&this_00->field_0x58 + 0x60) != 0) {
        QAbstractSocketEngine::setReceiver
                  ((QAbstractSocketEngine *)this_00->socketEngine,
                   &this_00->super_QAbstractSocketEngineReceiver);
      }
      QIODevice::open(this,openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                           super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
      if (socketState == ConnectedState) {
        cVar2 = QIODevice::isReadable();
        if (cVar2 != '\0') {
          iVar4 = QAbstractSocketEngine::inboundStreamCount
                            ((QAbstractSocketEngine *)this_00->socketEngine);
          QIODevicePrivate::setReadChannelCount(iVar7);
          if (iVar4 == 0) {
            *(undefined4 *)&this_00->field_0xa8 = 0;
          }
        }
        cVar2 = QIODevice::isWritable();
        if (cVar2 != '\0') {
          iVar4 = QAbstractSocketEngine::outboundStreamCount
                            ((QAbstractSocketEngine *)this_00->socketEngine);
          QIODevicePrivate::setWriteChannelCount(iVar7);
          if (iVar4 == 0) {
            *(undefined4 *)&this_00->field_0xac = 0;
          }
        }
      }
      else {
        *(undefined8 *)&this_00->field_0xa8 = 0;
      }
      if (this_00->state != socketState) {
        this_00->state = socketState;
        stateChanged(this,socketState);
      }
      this_00->pendingClose = false;
      (**(code **)(*(long *)this_00->socketEngine + 0x140))(this_00->socketEngine,1);
      qVar3 = QAbstractSocketEngine::localPort((QAbstractSocketEngine *)this_00->socketEngine);
      this_00->localPort = qVar3;
      qVar3 = QAbstractSocketEngine::peerPort((QAbstractSocketEngine *)this_00->socketEngine);
      this_00->peerPort = qVar3;
      QAbstractSocketEngine::localAddress((QAbstractSocketEngine *)&local_50);
      pQVar1 = (this_00->localAddress).d.d.ptr;
      (this_00->localAddress).d.d.ptr = (QHostAddressPrivate *)local_50.d;
      local_50.d = (Data *)pQVar1;
      QHostAddress::~QHostAddress((QHostAddress *)&local_50);
      QAbstractSocketEngine::peerAddress((QAbstractSocketEngine *)&local_50);
      pQVar1 = (this_00->peerAddress).d.d.ptr;
      (this_00->peerAddress).d.d.ptr = (QHostAddressPrivate *)local_50.d;
      local_50.d = (Data *)pQVar1;
      QHostAddress::~QHostAddress((QHostAddress *)&local_50);
      this_00->cachedSocketDescriptor = socketDescriptor;
      bVar8 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractSocket::setSocketDescriptor(qintptr socketDescriptor, SocketState socketState,
                                          OpenMode openMode)
{
    Q_D(QAbstractSocket);

    d->resetSocketLayer();
    d->setReadChannelCount(0);
    d->setWriteChannelCount(0);
    d->socketEngine = QAbstractSocketEngine::createSocketEngine(socketDescriptor, this);
    if (!d->socketEngine) {
        d->setError(UnsupportedSocketOperationError, tr("Operation on socket is not supported"));
        return false;
    }
    bool result = d->socketEngine->initialize(socketDescriptor, socketState);
    if (!result) {
        d->setError(d->socketEngine->error(), d->socketEngine->errorString());
        return false;
    }

    // Sync up with error string, which open() shall clear.
    d->socketError = UnknownSocketError;
    if (d->threadData.loadRelaxed()->hasEventDispatcher())
        d->socketEngine->setReceiver(d);

    QIODevice::open(openMode);

    if (socketState == ConnectedState) {
        if (isReadable()) {
            const int inboundStreamCount = d->socketEngine->inboundStreamCount();
            d->setReadChannelCount(qMax(1, inboundStreamCount));
            if (inboundStreamCount == 0)
                d->readChannelCount = 0;
        }
        if (isWritable()) {
            const int outboundStreamCount = d->socketEngine->outboundStreamCount();
            d->setWriteChannelCount(qMax(1, outboundStreamCount));
            if (outboundStreamCount == 0)
                d->writeChannelCount = 0;
        }
    } else {
        d->readChannelCount = d->writeChannelCount = 0;
    }

    if (d->state != socketState) {
        d->state = socketState;
        emit stateChanged(d->state);
    }

    d->pendingClose = false;
    d->socketEngine->setReadNotificationEnabled(true);
    d->localPort = d->socketEngine->localPort();
    d->peerPort = d->socketEngine->peerPort();
    d->localAddress = d->socketEngine->localAddress();
    d->peerAddress = d->socketEngine->peerAddress();
    d->cachedSocketDescriptor = socketDescriptor;

    return true;
}